

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void nukedopn2_set_options(void *chip,UINT32 flags)

{
  ym3438_t *opn2;
  UINT32 flags_local;
  void *chip_local;
  
  switch(flags >> 4 & 3) {
  case 0:
  default:
    NOPN2_SetChipType((ym3438_t *)chip,1);
    break;
  case 1:
    NOPN2_SetChipType((ym3438_t *)chip,2);
    break;
  case 2:
    NOPN2_SetChipType((ym3438_t *)chip,3);
    break;
  case 3:
    NOPN2_SetChipType((ym3438_t *)chip,0x11);
  }
  return;
}

Assistant:

void nukedopn2_set_options(void *chip, UINT32 flags)
{
    ym3438_t* opn2 = (ym3438_t*)chip;
    switch ((flags >> 4) & 0x03)
    {
    case 0x00: // YM2612
    default:
        NOPN2_SetChipType(opn2, ym3438_mode_ym2612);
        break;
    case 0x01: // ASIC YM3438
        NOPN2_SetChipType(opn2, ym3438_mode_readmode);
        break;
    case 0x02: // Discrete YM3438
        NOPN2_SetChipType(opn2, ym3438_mode_ym2612 | ym3438_mode_readmode);
        break;
    case 0x03: // YM2612 + MD1 filter (temporary hack)
        NOPN2_SetChipType(opn2, ym3438_mode_ym2612 | 0x10);
        break;
    }
}